

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

int __thiscall axl::io::SimpleMappedFile::open(SimpleMappedFile *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined4 extraout_var;
  long in_RCX;
  uint in_R8D;
  
  close(this,(int)__file);
  iVar1 = File::open(&this->m_file,__file,in_R8D);
  if ((char)iVar1 == '\0') {
    iVar1 = 0;
  }
  else {
    this->m_openFlags = in_R8D;
    if (in_RCX == 0) {
      iVar1 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    }
    else {
      iVar1 = Mapping::open(&this->m_mapping,(char *)this,__oflag,in_RCX,(ulong)in_R8D);
      iVar1 = (int)CONCAT71((int7)((ulong)CONCAT44(extraout_var,iVar1) >> 8),
                            CONCAT44(extraout_var,iVar1) != 0);
    }
  }
  return iVar1;
}

Assistant:

bool
SimpleMappedFile::open(
	const sl::StringRef& fileName,
	uint64_t offset,
	size_t size,
	uint_t flags
) {
	bool result;

	close();

	result = m_file.open(fileName, flags);
	if (!result)
		return false;

	m_openFlags = flags;
	return !size || m_mapping.open(&m_file, offset, size, flags);
}